

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_trie.c
# Opt level: O0

ngram_model_t * ngram_model_trie_read_dmp(ps_config_t *config,char *file_name,logmath_t *lmath)

{
  int iVar1;
  size_t sVar2;
  lm_trie_t *plVar3;
  uint32 *unigram_next_00;
  float fVar4;
  float local_498;
  float local_494;
  dmp_weight_t weightb;
  dmp_weight_t weightp;
  int32 mapid;
  int32 bigrams;
  ngram_raw_t **raw_ngrams;
  ngram_model_t *base;
  ngram_model_trie_t *model;
  FILE *fp;
  char str [1024];
  uint local_5c;
  int order;
  uint32 *unigram_next;
  uint32 counts [3];
  int32 count;
  int32 ts;
  int32 vn;
  uint32 j;
  int32 k;
  int32 is_pipe;
  uint8 do_swap;
  logmath_t *lmath_local;
  char *file_name_local;
  ps_config_t *config_local;
  
  _is_pipe = lmath;
  lmath_local = (logmath_t *)file_name;
  file_name_local = (char *)config;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_trie.c"
          ,0x1cf,"Trying to read LM in dmp format\n");
  model = (ngram_model_trie_t *)fopen_comp((char *)lmath_local,"rb",(int32 *)&j);
  if ((FILE *)model == (FILE *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_trie.c"
            ,0x1d1,"Dump file %s not found\n",lmath_local);
    config_local = (ps_config_t *)0x0;
  }
  else {
    k._3_1_ = 0;
    fread(&vn,4,1,(FILE *)model);
    if (vn != 0x11) {
      vn = vn >> 0x18 & 0xffU | vn >> 8 & 0xff00U | (vn & 0xff00U) << 8 | vn << 0x18;
      if (vn != 0x11) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_trie.c"
                ,0x1dc,"Wrong magic header size number %x: %s is not a dump file\n",(ulong)(uint)vn,
                lmath_local);
        return (ngram_model_t *)0x0;
      }
      k._3_1_ = 1;
      vn = 0x11;
    }
    sVar2 = fread(&fp,1,(long)vn,(FILE *)model);
    if (sVar2 == (long)vn) {
      iVar1 = strncmp((char *)&fp,"Darpa Trigram LM",(long)vn);
      if (iVar1 == 0) {
        sVar2 = fread(&vn,4,1,(FILE *)model);
        if (sVar2 == 1) {
          if (k._3_1_ != 0) {
            vn = vn >> 0x18 & 0xffU | vn >> 8 & 0xff00U | (vn & 0xff00U) << 8 | vn << 0x18;
          }
          sVar2 = fread(&fp,1,(long)vn,(FILE *)model);
          if (sVar2 == (long)vn) {
            sVar2 = fread(&count,4,1,(FILE *)model);
            if (sVar2 == 1) {
              if (k._3_1_ != 0) {
                count = count >> 0x18 & 0xffU | count >> 8 & 0xff00U | (count & 0xff00U) << 8 |
                        count << 0x18;
              }
              if (count < 1) {
                sVar2 = fread(counts + 2,4,1,(FILE *)model);
                if (sVar2 == 1) {
                  if (k._3_1_ != 0) {
                    counts[2] = (int)counts[2] >> 0x18 & 0xffU | (int)counts[2] >> 8 & 0xff00U |
                                (counts[2] & 0xff00) << 8 | counts[2] << 0x18;
                  }
                  do {
                    sVar2 = fread(&vn,4,1,(FILE *)model);
                    if (sVar2 != 1) {
                      return (ngram_model_t *)0x0;
                    }
                    if (k._3_1_ != 0) {
                      vn = vn >> 0x18 & 0xffU | vn >> 8 & 0xff00U | (vn & 0xff00U) << 8 | vn << 0x18
                      ;
                    }
                    if (vn == 0) {
                      sVar2 = fread(counts + 1,4,1,(FILE *)model);
                      if (sVar2 != 1) {
                        return (ngram_model_t *)0x0;
                      }
                      if (k._3_1_ != 0) {
                        counts[1] = (int)counts[1] >> 0x18 & 0xffU | (int)counts[1] >> 8 & 0xff00U |
                                    (counts[1] & 0xff00) << 8 | counts[1] << 0x18;
                      }
                      unigram_next._0_4_ = counts[1];
                      goto LAB_00116dc9;
                    }
                    sVar2 = fread(&fp,1,(long)vn,(FILE *)model);
                  } while (sVar2 == (long)vn);
                  err_msg(ERR_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_trie.c"
                          ,0x208,"Failed to read word\n");
                  config_local = (ps_config_t *)0x0;
                }
                else {
                  config_local = (ps_config_t *)0x0;
                }
              }
              else {
                unigram_next._0_4_ = count;
LAB_00116dc9:
                sVar2 = fread(counts + 1,4,1,(FILE *)model);
                if (sVar2 == 1) {
                  if (k._3_1_ != 0) {
                    counts[1] = (int)counts[1] >> 0x18 & 0xffU | (int)counts[1] >> 8 & 0xff00U |
                                (counts[1] & 0xff00) << 8 | counts[1] << 0x18;
                  }
                  unigram_next._4_4_ = counts[1];
                  sVar2 = fread(counts + 1,4,1,(FILE *)model);
                  if (sVar2 == 1) {
                    if (k._3_1_ != 0) {
                      counts[1] = (int)counts[1] >> 0x18 & 0xffU | (int)counts[1] >> 8 & 0xff00U |
                                  (counts[1] & 0xff00) << 8 | counts[1] << 0x18;
                    }
                    counts[0] = counts[1];
                    err_msg(ERR_INFO,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_trie.c"
                            ,0x221,"ngrams 1=%d, 2=%d, 3=%d\n",(ulong)(uint)unigram_next,
                            (ulong)unigram_next._4_4_,counts[1]);
                    raw_ngrams = (ngram_raw_t **)
                                 __ckd_calloc__(1,0x68,
                                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_trie.c"
                                                ,0x223);
                    if (counts[0] == 0) {
                      if (unigram_next._4_4_ == 0) {
                        local_5c = 1;
                      }
                      else {
                        local_5c = 2;
                      }
                    }
                    else {
                      local_5c = 3;
                    }
                    base = (ngram_model_t *)raw_ngrams;
                    ngram_model_init((ngram_model_t *)raw_ngrams,&ngram_model_trie_funcs,_is_pipe,
                                     local_5c,(uint)unigram_next);
                    plVar3 = lm_trie_create((uint)unigram_next,local_5c);
                    *(lm_trie_t **)(base + 1) = plVar3;
                    unigram_next_00 =
                         (uint32 *)
                         __ckd_calloc__((long)(int)((uint)unigram_next + 1),8,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_trie.c"
                                        ,0x231);
                    for (ts = 0; (uint)ts <= (uint)unigram_next; ts = ts + 1) {
                      fread(&weightb,4,1,(FILE *)model);
                      fread(&local_494,4,1,(FILE *)model);
                      fread(&local_498,4,1,(FILE *)model);
                      fread(&weightp,4,1,(FILE *)model);
                      if (k._3_1_ != 0) {
                        local_494 = (float)((int)local_494 >> 0x18 & 0xffU |
                                            (int)local_494 >> 8 & 0xff00U |
                                            ((uint)local_494 & 0xff00) << 8 | (int)local_494 << 0x18
                                           );
                        local_498 = (float)((int)local_498 >> 0x18 & 0xffU |
                                            (int)local_498 >> 8 & 0xff00U |
                                            ((uint)local_498 & 0xff00) << 8 | (int)local_498 << 0x18
                                           );
                        weightp.l = weightp.l >> 0x18 & 0xffU | weightp.l >> 8 & 0xff00U |
                                    (weightp.l & 0xff00U) << 8 | weightp.l << 0x18;
                      }
                      fVar4 = logmath_log10_to_log_float(_is_pipe,(float64)(double)local_494);
                      *(float *)(*(long *)(*(long *)(base + 1) + 0x10) + (ulong)(uint)ts * 0xc) =
                           fVar4;
                      fVar4 = logmath_log10_to_log_float(_is_pipe,(float64)(double)local_498);
                      *(float *)(*(long *)(*(long *)(base + 1) + 0x10) + (ulong)(uint)ts * 0xc + 4)
                           = fVar4;
                      *(dmp_weight_t *)
                       (*(long *)(*(long *)(base + 1) + 0x10) + (ulong)(uint)ts * 0xc + 8) = weightp
                      ;
                      *(dmp_weight_t *)(unigram_next_00 + (uint)ts) = weightp;
                    }
                    if (1 < local_5c) {
                      _mapid = ngrams_raw_read_dmp((FILE *)model,_is_pipe,(uint32 *)&unigram_next,
                                                   local_5c,unigram_next_00,k._3_1_);
                      if (_mapid == (ngram_raw_t **)0x0) {
                        ngram_model_free((ngram_model_t *)raw_ngrams);
                        ckd_free(unigram_next_00);
                        fclose_comp((FILE *)model,j);
                        return (ngram_model_t *)0x0;
                      }
                      lm_trie_build(*(lm_trie_t **)(base + 1),_mapid,(uint32 *)&unigram_next,
                                    (uint32 *)raw_ngrams[1],local_5c);
                      ngrams_raw_free(_mapid,(uint32 *)&unigram_next,local_5c);
                    }
                    ckd_free(unigram_next_00);
                    read_word_str((ngram_model_t *)raw_ngrams,(FILE *)model,(uint)k._3_1_);
                    fclose_comp((FILE *)model,j);
                    config_local = (ps_config_t *)raw_ngrams;
                  }
                  else {
                    config_local = (ps_config_t *)0x0;
                  }
                }
                else {
                  config_local = (ps_config_t *)0x0;
                }
              }
            }
            else {
              config_local = (ps_config_t *)0x0;
            }
          }
          else {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_trie.c"
                    ,0x1ef,"Cannot read LM filename in header\n");
            config_local = (ps_config_t *)0x0;
          }
        }
        else {
          config_local = (ps_config_t *)0x0;
        }
      }
      else {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_trie.c"
                ,0x1e6,"Wrong header %s: %s is not a dump file\n","Darpa Trigram LM");
        config_local = (ps_config_t *)0x0;
      }
    }
    else {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_trie.c"
              ,0x1e2,"Cannot read header\n");
      config_local = (ps_config_t *)0x0;
    }
  }
  return (ngram_model_t *)config_local;
}

Assistant:

ngram_model_t *
ngram_model_trie_read_dmp(ps_config_t * config,
                          const char *file_name, logmath_t * lmath)
{
    uint8 do_swap;
    int32 is_pipe;
    int32 k;
    uint32 j;
    int32 vn, ts;
    int32 count;
    uint32 counts[3];
    uint32 *unigram_next;
    int order;
    char str[1024];
    FILE *fp;
    ngram_model_trie_t *model;
    ngram_model_t *base;
    ngram_raw_t **raw_ngrams;

    (void)config;
    E_INFO("Trying to read LM in dmp format\n");
    if ((fp = fopen_comp(file_name, "rb", &is_pipe)) == NULL) {
        E_ERROR("Dump file %s not found\n", file_name);
        return NULL;
    }

    do_swap = FALSE;
    fread(&k, sizeof(k), 1, fp);
    if (k != strlen(dmp_hdr) + 1) {
        SWAP_INT32(&k);
        if (k != strlen(dmp_hdr) + 1) {
            E_ERROR
                ("Wrong magic header size number %x: %s is not a dump file\n",
                 k, file_name);
            return NULL;
        }
        do_swap = 1;
    }
    if (fread(str, 1, k, fp) != (size_t) k) {
        E_ERROR("Cannot read header\n");
        return NULL;
    }
    if (strncmp(str, dmp_hdr, k) != 0) {
        E_ERROR("Wrong header %s: %s is not a dump file\n", dmp_hdr);
        return NULL;
    }

    if (fread(&k, sizeof(k), 1, fp) != 1)
        return NULL;
    if (do_swap)
        SWAP_INT32(&k);
    if (fread(str, 1, k, fp) != (size_t) k) {
        E_ERROR("Cannot read LM filename in header\n");
        return NULL;
    }

    /* read version#, if present (must be <= 0) */
    if (fread(&vn, sizeof(vn), 1, fp) != 1)
        return NULL;
    if (do_swap)
        SWAP_INT32(&vn);
    if (vn <= 0) {
        /* read and don't compare timestamps (we don't care) */
        if (fread(&ts, sizeof(ts), 1, fp) != 1)
            return NULL;
        if (do_swap)
            SWAP_INT32(&ts);

        /* read and skip format description */
        for (;;) {
            if (fread(&k, sizeof(k), 1, fp) != 1)
                return NULL;
            if (do_swap)
                SWAP_INT32(&k);
            if (k == 0)
                break;
            if (fread(str, 1, k, fp) != (size_t) k) {
                E_ERROR("Failed to read word\n");
                return NULL;
            }
        }
        /* read model->ucount */
        if (fread(&count, sizeof(count), 1, fp) != 1)
            return NULL;
        if (do_swap)
            SWAP_INT32(&count);
        counts[0] = count;
    }
    else {
        counts[0] = vn;
    }
    /* read model->bcount, tcount */
    if (fread(&count, sizeof(count), 1, fp) != 1)
        return NULL;
    if (do_swap)
        SWAP_INT32(&count);
    counts[1] = count;
    if (fread(&count, sizeof(count), 1, fp) != 1)
        return NULL;
    if (do_swap)
        SWAP_INT32(&count);
    counts[2] = count;
    E_INFO("ngrams 1=%d, 2=%d, 3=%d\n", counts[0], counts[1], counts[2]);

    model = (ngram_model_trie_t *) ckd_calloc(1, sizeof(*model));
    base = &model->base;
    if (counts[2] > 0)
        order = 3;
    else if (counts[1] > 0)
        order = 2;
    else
        order = 1;
    ngram_model_init(base, &ngram_model_trie_funcs, lmath, order,
                     (int32) counts[0]);

    model->trie = lm_trie_create(counts[0], order);

    unigram_next =
        (uint32 *) ckd_calloc((int32) counts[0] + 1, sizeof(unigram_next));
    for (j = 0; j <= counts[0]; j++) {
        int32 bigrams;
        int32 mapid;
        dmp_weight_t weightp;
        dmp_weight_t weightb;

        /* Skip over the mapping ID, we don't care about it. */
        /* Read the weights from actual unigram structure. */
        fread(&mapid, sizeof(int32), 1, fp);
        fread(&weightp, sizeof(weightp), 1, fp);
        fread(&weightb, sizeof(weightb), 1, fp);
        fread(&bigrams, sizeof(int32), 1, fp);
        if (do_swap) {
            SWAP_INT32(&weightp.l);
            SWAP_INT32(&weightb.l);
            SWAP_INT32(&bigrams);
        }
        model->trie->unigrams[j].prob = logmath_log10_to_log_float(lmath, weightp.f);
        model->trie->unigrams[j].bo = logmath_log10_to_log_float(lmath, weightb.f);
        model->trie->unigrams[j].next = bigrams;
        unigram_next[j] = bigrams;
    }

    if (order > 1) {
        raw_ngrams =
            ngrams_raw_read_dmp(fp, lmath, counts, order, unigram_next,
                                do_swap);
        if (raw_ngrams == NULL) {
            ngram_model_free(base);
            ckd_free(unigram_next);
            fclose_comp(fp, is_pipe);
            return NULL;
        }
        lm_trie_build(model->trie, raw_ngrams, counts, base->n_counts, order);        
        ngrams_raw_free(raw_ngrams, counts, order);
    }
    
    /* Sentinel unigram and bigrams read before */
    ckd_free(unigram_next);

    /* read ascii word strings */
    read_word_str(base, fp, do_swap);

    fclose_comp(fp, is_pipe);
    return base;
}